

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_ddes_blend(REF_DBL mach,REF_DBL reynolds_number,REF_DBL sqrt_vel_grad_dot_grad,
                   REF_DBL distance,REF_DBL nu,REF_DBL *fd)

{
  double dVar1;
  REF_DBL RVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (mach * nu) / reynolds_number;
  dVar3 = sqrt_vel_grad_dot_grad * 0.41 * 0.41 * distance * distance;
  dVar4 = dVar3 * 1e+20;
  if (dVar4 <= -dVar4) {
    dVar4 = -dVar4;
  }
  dVar5 = dVar1;
  if (dVar1 <= -dVar1) {
    dVar5 = -dVar1;
  }
  RVar2 = 0.0;
  if (dVar5 < dVar4) {
    dVar4 = pow((dVar1 / dVar3) * 8.0,3.0);
    dVar4 = tanh(dVar4);
    RVar2 = 1.0 - dVar4;
  }
  *fd = RVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_ddes_blend(REF_DBL mach, REF_DBL reynolds_number,
                                       REF_DBL sqrt_vel_grad_dot_grad,
                                       REF_DBL distance, REF_DBL nu,
                                       REF_DBL *fd) {
  REF_DBL rd;
  REF_DBL kappa = 0.41;
  REF_DBL num, denom;
  num = mach * nu / reynolds_number;
  denom = sqrt_vel_grad_dot_grad * kappa * kappa * distance * distance;
  if (ref_math_divisible(num, denom)) {
    rd = num / denom;
    *fd = 1.0 - tanh(pow(8.0 * rd, 3));
  } else {
    *fd = 0.0;
  };
  return REF_SUCCESS;
}